

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext *ctx,ExprMemberAccess *node)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  LLVMValueRef pLVar5;
  uint uVar6;
  
  CompileLlvm(ctx,node->value);
  pp_Var2 = node->value->type[1]._vptr_TypeBase;
  if (pp_Var2 != (_func_int **)0x0) {
    uVar1 = *(uint *)(pp_Var2 + 1);
    if (uVar1 < 0x1a) {
      uVar6 = 0;
      pp_Var4 = (_func_int **)0x0;
      if ((0x3130000U >> (uVar1 & 0x1f) & 1) != 0) {
        uVar6 = (uint)(uVar1 == 0x14);
        pp_Var4 = pp_Var2;
      }
      goto LAB_001767a8;
    }
  }
  pp_Var4 = (_func_int **)0x0;
  uVar6 = 0;
LAB_001767a8:
  pp_Var4 = pp_Var4 + 0xd;
  do {
    uVar6 = uVar6 + 1;
    p_Var3 = *pp_Var4;
    if (p_Var3 == (_func_int *)0x0) {
LAB_001767e7:
      __assert_fail("memberIndex != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x589,
                    "LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &, ExprMemberAccess *)"
                   );
    }
    if (*(VariableData **)(p_Var3 + 8) == node->member->variable) {
      if (uVar6 != 0) {
        pLVar5 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
        return pLVar5;
      }
      goto LAB_001767e7;
    }
    pp_Var4 = (_func_int **)(p_Var3 + 0x18);
  } while( true );
}

Assistant:

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &ctx, ExprMemberAccess *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	TypeRef *typeRef = getType<TypeRef>(node->value->type);
	TypeStruct *typeStruct = getType<TypeStruct>(typeRef->subType);

	unsigned memberIndex = ~0u;

	unsigned currMember = 0;

	// Unsized array types have a hidden member (pointer) at index 0
	if(isType<TypeUnsizedArray>(typeStruct))
		currMember++;

	for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
	{
		if(curr->variable == node->member->variable)
		{
			memberIndex = currMember;
			break;
		}

		currMember++;
	}

	assert(memberIndex != ~0u);

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), memberIndex, true) };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}